

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

bool __thiscall
google::protobuf::Reflection::InsertOrLookupMapValue
          (Reflection *this,Message *message,FieldDescriptor *field,MapKey *key,MapValueRef *val)

{
  bool bVar1;
  CppType type;
  int iVar2;
  Descriptor *this_00;
  FieldDescriptor *message_00;
  MapFieldBase *pMVar3;
  undefined8 in_RCX;
  char *in_RDI;
  Reflection *in_R8;
  char *unaff_retaddr;
  FieldDescriptor *in_stack_00000008;
  Descriptor *in_stack_00000010;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  Reflection *this_01;
  allocator local_49;
  string local_48 [32];
  Reflection *local_28;
  undefined8 local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  bVar1 = anon_unknown_0::IsMapFieldInApi((FieldDescriptor *)0x40a973);
  if (!bVar1) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI);
  }
  this_01 = local_28;
  this_00 = FieldDescriptor::message_type
                      ((FieldDescriptor *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"value",&local_49);
  message_00 = Descriptor::FindFieldByName(this_00,(string *)this_01);
  type = FieldDescriptor::cpp_type((FieldDescriptor *)0x40a9fd);
  MapValueRef::SetType((MapValueRef *)this_01,type);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pMVar3 = MutableRaw<google::protobuf::internal::MapFieldBase>
                     (this_01,(Message *)message_00,
                      (FieldDescriptor *)CONCAT44(type,in_stack_ffffffffffffff70));
  iVar2 = (*pMVar3->_vptr_MapFieldBase[3])(pMVar3,local_20,local_28);
  return (bool)((byte)iVar2 & 1);
}

Assistant:

bool Reflection::InsertOrLookupMapValue(Message* message,
                                        const FieldDescriptor* field,
                                        const MapKey& key,
                                        MapValueRef* val) const {
  USAGE_CHECK(IsMapFieldInApi(field), "InsertOrLookupMapValue",
              "Field is not a map field.");
  val->SetType(field->message_type()->FindFieldByName("value")->cpp_type());
  return MutableRaw<MapFieldBase>(message, field)
      ->InsertOrLookupMapValue(key, val);
}